

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall FailableMemoryAllocator::checkAllFailedAllocsWereDone(FailableMemoryAllocator *this)

{
  int iVar1;
  char *in_RDI;
  SimpleString failText;
  UtestShell *currentTest;
  UtestShell *in_stack_ffffffffffffff48;
  undefined1 *puVar2;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  UtestShell *message;
  UtestShell *pUVar3;
  UtestShell *in_stack_ffffffffffffff78;
  SimpleString in_stack_ffffffffffffff80;
  undefined1 local_78 [64];
  char local_38 [24];
  char local_20 [16];
  UtestShell *local_10;
  
  if (*(long *)(in_RDI + 0x28) != 0) {
    local_10 = UtestShell::getCurrent();
    SimpleString::SimpleString
              ((SimpleString *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               (char *)in_stack_ffffffffffffff48);
    if (*(long *)(*(long *)(in_RDI + 0x28) + 8) == 0) {
      StringFromFormat(local_38,"Expected allocation number %d was never done",
                       (ulong)**(uint **)(in_RDI + 0x28));
      SimpleString::operator=
                ((SimpleString *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 (SimpleString *)in_stack_ffffffffffffff48);
      SimpleString::~SimpleString((SimpleString *)0x20d5c3);
    }
    else {
      StringFromFormat(local_20,"Expected failing alloc at %s:%d was never done",
                       *(undefined8 *)(*(long *)(in_RDI + 0x28) + 8),
                       (ulong)*(uint *)(*(long *)(in_RDI + 0x28) + 0x10));
      SimpleString::operator=
                ((SimpleString *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 (SimpleString *)in_stack_ffffffffffffff48);
      SimpleString::~SimpleString((SimpleString *)0x20d538);
    }
    message = local_10;
    pUVar3 = local_10;
    UtestShell::getName(in_stack_ffffffffffffff48);
    SimpleString::asCharString((SimpleString *)&stack0xffffffffffffff80);
    iVar1 = UtestShell::getLineNumber(local_10);
    FailFailure::FailFailure
              ((FailFailure *)in_stack_ffffffffffffff80.buffer_,in_stack_ffffffffffffff78,in_RDI,
               (int)((ulong)pUVar3 >> 0x20),(SimpleString *)message);
    puVar2 = &stack0xffffffffffffff78;
    TestTerminatorWithoutExceptions::TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)CONCAT44(iVar1,in_stack_ffffffffffffff50));
    (*pUVar3->_vptr_UtestShell[0x25])(pUVar3,local_78,puVar2);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)0x20d68f);
    FailFailure::~FailFailure((FailFailure *)0x20d699);
    SimpleString::~SimpleString((SimpleString *)0x20d6a3);
    SimpleString::~SimpleString((SimpleString *)0x20d6b0);
  }
  return;
}

Assistant:

void FailableMemoryAllocator::checkAllFailedAllocsWereDone()
{
  if (head_) {
    UtestShell* currentTest = UtestShell::getCurrent();
    SimpleString failText;
    if (head_->file_)
      failText = StringFromFormat("Expected failing alloc at %s:%d was never done", head_->file_, head_->line_);
    else
      failText = StringFromFormat("Expected allocation number %d was never done", head_->allocNumberToFail_);

    currentTest->failWith(FailFailure(currentTest, currentTest->getName().asCharString(),
    currentTest->getLineNumber(), failText), TestTerminatorWithoutExceptions());
  }
}